

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O1

void __thiscall miniminer_tests::manual_ctor::test_method(manual_ctor *this)

{
  long lVar1;
  CTxMemPool *pCVar2;
  pointer psVar3;
  element_type *peVar4;
  uchar *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint256 *puVar9;
  base_blob<256U> *pbVar10;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar11;
  undefined8 uVar12;
  allocator_type *__a;
  iterator pvVar13;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  *__args_4;
  iterator pvVar14;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<transaction_identifier<false>_> __l_06;
  initializer_list<transaction_identifier<false>_> __l_07;
  initializer_list<transaction_identifier<false>_> __l_08;
  initializer_list<transaction_identifier<false>_> __l_09;
  initializer_list<transaction_identifier<false>_> __l_10;
  initializer_list<transaction_identifier<false>_> __l_11;
  initializer_list<transaction_identifier<false>_> __l_12;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar15;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined4 local_3bc;
  lazy_ostream local_3b8;
  undefined1 *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  int64_t child_vsize;
  int64_t tx_vsize;
  CTransactionRef child;
  CTransactionRef parent_double_low_feerate;
  CTransactionRef grandparent_low_feerate;
  CTransactionRef parent_med_feerate;
  CTransactionRef grandparent_double_low_feerate;
  CTransactionRef parent_high_feerate;
  CTransactionRef grandparent_zero_fee;
  undefined4 *local_2b0;
  _Rb_tree_node_base local_2a8;
  mapped_type_conflict *local_288;
  assertion_result local_280;
  mapped_type_conflict **local_268;
  char *local_260;
  char *local_258;
  assertion_result local_250;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  MiniMiner miniminer_manual;
  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  sequences;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar11 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x28e,"test_method","m_node.mempool");
  pCVar2 = (puVar11->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(pCVar2->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  psVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_TestChain100Setup).m_coinbase_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0046cffe;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0046cbb4:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0046cffe;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
  }
  else {
    peVar4 = (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    puVar9 = &(peVar4->hash).m_wrapped;
    miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0]
    ;
    miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
    miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
    miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
    miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
    miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
    miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
    miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
    puVar5 = (uchar *)((long)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         *(undefined8 *)
          ((long)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)((long)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
    ;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
    ;
    __l._M_len = 1;
    __l._M_array = (iterator)&miniminer_manual;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l,
               (allocator_type *)&sequences);
    make_tx((miniminer_tests *)&grandparent_zero_fee,
            (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
    if (descendant_caches._M_t._M_impl._0_8_ != 0) {
      operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                      (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      - descendant_caches._M_t._M_impl._0_8_);
    }
    puVar9 = &((grandparent_zero_fee.
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
              m_wrapped;
    miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0]
    ;
    miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
    miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
    miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
    miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
    miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
    miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
    miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
    pbVar10 = &((grandparent_zero_fee.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
               m_wrapped.super_base_blob<256U>;
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         *(undefined8 *)
          (((grandparent_zero_fee.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)
          (((grandparent_zero_fee.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
    ;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&miniminer_manual;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_00,
               (allocator_type *)&sequences);
    make_tx((miniminer_tests *)&parent_high_feerate,
            (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
    if (descendant_caches._M_t._M_impl._0_8_ != 0) {
      operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                      (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      - descendant_caches._M_t._M_impl._0_8_);
    }
    psVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_TestChain100Setup).m_coinbase_txns.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) < 3)
    goto LAB_0046cbb4;
    peVar4 = psVar3[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    miniminer_manual._0_8_ = *(undefined8 *)&(peVar4->hash).m_wrapped;
    puVar5 = (uchar *)((long)&peVar4->hash + 8);
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         *(undefined8 *)((long)&peVar4->hash + 0x10);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)((long)&peVar4->hash + 0x18);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
    ;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&miniminer_manual;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_01,
               (allocator_type *)&sequences);
    make_tx((miniminer_tests *)&grandparent_double_low_feerate,
            (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
    if (descendant_caches._M_t._M_impl._0_8_ != 0) {
      operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                      (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      - descendant_caches._M_t._M_impl._0_8_);
    }
    puVar9 = &((grandparent_double_low_feerate.
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
              m_wrapped;
    miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0]
    ;
    miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
    miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
    miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
    miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
    miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
    miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
    miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
    pbVar10 = &((grandparent_double_low_feerate.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
               m_wrapped.super_base_blob<256U>;
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
    miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         *(undefined8 *)
          (((grandparent_double_low_feerate.
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)
          (((grandparent_double_low_feerate.
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
    ;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&miniminer_manual;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_02,
               (allocator_type *)&sequences);
    make_tx((miniminer_tests *)&parent_med_feerate,
            (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
    if (descendant_caches._M_t._M_impl._0_8_ != 0) {
      operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                      (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      - descendant_caches._M_t._M_impl._0_8_);
    }
    psVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)((long)(this->super_TestChain100Setup).m_coinbase_txns.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)) {
      peVar4 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      miniminer_manual._0_8_ = *(undefined8 *)&(peVar4->hash).m_wrapped;
      puVar5 = (uchar *)((long)&peVar4->hash + 8);
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)((long)&peVar4->hash + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)((long)&peVar4->hash + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           0;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&miniminer_manual;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_03,
                 (allocator_type *)&sequences);
      make_tx((miniminer_tests *)&grandparent_low_feerate,
              (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
      if (descendant_caches._M_t._M_impl._0_8_ != 0) {
        operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                        (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent - descendant_caches._M_t._M_impl._0_8_);
      }
      puVar9 = &((grandparent_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((grandparent_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((grandparent_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((grandparent_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           0;
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&miniminer_manual;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_04,
                 (allocator_type *)&sequences);
      make_tx((miniminer_tests *)&parent_double_low_feerate,
              (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
      if (descendant_caches._M_t._M_impl._0_8_ != 0) {
        operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                        (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent - descendant_caches._M_t._M_impl._0_8_);
      }
      puVar9 = &((parent_high_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((parent_high_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((parent_high_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((parent_high_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           0;
      uVar12 = *(undefined8 *)
                ((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ =
           SUB84((ulong)uVar7 >> 0x20,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = (_Rb_tree_color)((ulong)uVar8 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = *(_Base_ptr *)
                   ((parent_med_feerate.
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = *(_Base_ptr *)
                 (((parent_med_feerate.
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
                  ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = *(_Base_ptr *)
                  (((parent_med_feerate.
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
      _M_node_count =
           *(size_t *)
            (((parent_med_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
      __l_05._M_len = 3;
      __l_05._M_array = (iterator)&miniminer_manual;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_05,
                 (allocator_type *)&sequences);
      make_tx((miniminer_tests *)&child,
              (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,1);
      if (descendant_caches._M_t._M_impl._0_8_ != 0) {
        operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                        (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent - descendant_caches._M_t._M_impl._0_8_);
      }
      tx_vsize = 100;
      child_vsize = 1000;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      miniminer_manual._0_8_ = miniminer_manual._0_8_ & 0xffffffff00000000;
      descendant_caches._M_t._M_impl._0_8_ =
           descendant_caches._M_t._M_impl._0_8_ & 0xffffffff00000000;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long_const&,int,int>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&grandparent_zero_fee,&tx_vsize,&tx_vsize,(int *)&miniminer_manual,
                 (int *)&descendant_caches);
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&parent_high_feerate,&tx_vsize,(long *)&miniminer_manual,&high_fee,
                 &high_fee);
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 3;
      descendant_caches._M_t._M_impl._0_8_ = 1000;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long_const&,long,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&grandparent_double_low_feerate,&tx_vsize,&tx_vsize,
                 (long *)&miniminer_manual,(long *)&descendant_caches);
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0;
      descendant_caches._M_t._M_impl._0_8_ = 6000;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&parent_med_feerate,&tx_vsize,(long *)&miniminer_manual,&med_fee,
                 (long *)&descendant_caches);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&grandparent_low_feerate,&tx_vsize,&tx_vsize,&low_fee,&low_fee);
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0;
      descendant_caches._M_t._M_impl._0_8_ = 1000;
      sequences._M_t._M_impl._0_8_ = 0x5dc;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&parent_double_low_feerate,&tx_vsize,(long *)&miniminer_manual,
                 (long *)&descendant_caches,(long *)&sequences);
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 6;
      __args_4 = &descendant_caches;
      descendant_caches._M_t._M_impl._0_8_ = 0x1a5e0;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&child,&child_vsize,(long *)&miniminer_manual,&low_fee,
                 (long *)__args_4);
      peVar4 = grandparent_zero_fee.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      puVar9 = &((grandparent_zero_fee.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((grandparent_zero_fee.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((grandparent_zero_fee.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((grandparent_zero_fee.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar12 = *(undefined8 *)
                ((parent_high_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((parent_high_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((parent_high_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((parent_high_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      uVar12 = *(undefined8 *)
                ((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = *(_Base_ptr *)
                   (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = *(_Base_ptr *)
                 (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = *(_Base_ptr *)
                  (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = (_Rb_tree_color)uVar12;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = SUB84((ulong)uVar12 >> 0x20,0);
      __l_06._M_len = 3;
      __l_06._M_array = (iterator)&miniminer_manual;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&sequences,__l_06,(less<transaction_identifier<false>_> *)&local_280,
            (allocator_type *)&local_2a8);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&sequences);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&sequences);
      peVar4 = grandparent_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar9 = &((grandparent_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((grandparent_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((grandparent_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((grandparent_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar12 = *(undefined8 *)
                ((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      uVar12 = *(undefined8 *)
                ((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = *(_Base_ptr *)
                   (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = *(_Base_ptr *)
                 (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = *(_Base_ptr *)
                  (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = (_Rb_tree_color)uVar12;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = SUB84((ulong)uVar12 >> 0x20,0);
      __l_07._M_len = 3;
      __l_07._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&sequences,__l_07,(less<transaction_identifier<false>_> *)&local_280,
            (allocator_type *)&local_2a8);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&sequences);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&sequences);
      peVar4 = grandparent_double_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar9 = &((grandparent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((grandparent_double_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((grandparent_double_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((grandparent_double_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar12 = *(undefined8 *)
                ((parent_med_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((parent_med_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((parent_med_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((parent_med_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      uVar12 = *(undefined8 *)
                ((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = *(_Base_ptr *)
                   (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = *(_Base_ptr *)
                 (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = *(_Base_ptr *)
                  (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = (_Rb_tree_color)uVar12;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = SUB84((ulong)uVar12 >> 0x20,0);
      __l_08._M_len = 3;
      __l_08._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&sequences,__l_08,(less<transaction_identifier<false>_> *)&local_280,
            (allocator_type *)&local_2a8);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&sequences);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&sequences);
      peVar4 = parent_high_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar9 = &((parent_high_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((parent_high_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((parent_high_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((parent_high_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar12 = *(undefined8 *)
                ((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_09._M_len = 2;
      __l_09._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&sequences,__l_09,(less<transaction_identifier<false>_> *)&local_280,
            (allocator_type *)&local_2a8);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&sequences);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&sequences);
      peVar4 = parent_med_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      puVar9 = &((parent_med_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((parent_med_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((parent_med_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((parent_med_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar12 = *(undefined8 *)
                ((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_10._M_len = 2;
      __l_10._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&sequences,__l_10,(less<transaction_identifier<false>_> *)&local_280,
            (allocator_type *)&local_2a8);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&sequences);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&sequences);
      peVar4 = parent_double_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar9 = &((parent_double_low_feerate.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
                m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      pbVar10 = &((parent_double_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
                 .m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((parent_double_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((parent_double_low_feerate.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar12 = *(undefined8 *)
                ((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar8 = *(undefined8 *)
               (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar12;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar12 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      __l_11._M_len = 2;
      __l_11._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&sequences,__l_11,(less<transaction_identifier<false>_> *)&local_280,
            (allocator_type *)&local_2a8);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&sequences);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&sequences);
      peVar4 = child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar9 = &((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped;
      sequences._M_t._M_impl._0_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[0];
      sequences._M_t._M_impl._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      sequences._M_t._M_impl._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      sequences._M_t._M_impl._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      sequences._M_t._M_impl._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      sequences._M_t._M_impl._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      sequences._M_t._M_impl._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      sequences._M_t._M_impl._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      sequences._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      sequences._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      sequences._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           *(_Base_ptr *)
            (((child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __a = (allocator_type *)&local_2a8;
      __l_12._M_len = 1;
      __l_12._M_array = (iterator)&sequences;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_12,(less<transaction_identifier<false>_> *)&local_280,__a);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar4->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      ::node::MiniMiner::MiniMiner(&miniminer_manual,&miniminer_info,&descendant_caches);
      local_358 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_350 = "";
      local_368 = &boost::unit_test::basic_cstring<char_const>::null;
      local_360 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar15 = 0x46bf64;
      file.m_end = (iterator)0x2b4;
      file.m_begin = (iterator)&local_358;
      msg.m_end = (iterator)__args_4;
      msg.m_begin = (iterator)__a;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg)
      ;
      local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)miniminer_manual.m_ready_to_calculate;
      local_280.m_message.px = (element_type *)0x0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_2a8._0_8_ = "miniminer_manual.IsReadyToCalculate()";
      local_2a8._M_parent = (_Base_ptr)0xea3d83;
      sequences._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           sequences._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      sequences._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
      sequences._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      sequences._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_2a8;
      local_378 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_370 = "";
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_280,(lazy_ostream *)&sequences,1,0,WARN,_cVar15,(size_t)&local_378,0x2b4);
      boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
      ::node::MiniMiner::Linearize(&sequences,&miniminer_manual);
      local_388 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_380 = "";
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      local_390 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x2b8;
      file_00.m_begin = (iterator)&local_388;
      msg_00.m_end = pvVar14;
      msg_00.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_398,
                 msg_00);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(grandparent_zero_fee.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
      local_2b0 = &local_3bc;
      local_3bc = 0;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 0);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_268 = &local_288;
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea460f,(size_t)&local_260,0x2b8,&local_280,"0",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      local_3d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_3c8 = "";
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x2b9;
      file_01.m_begin = (iterator)&local_3d0;
      msg_01.m_end = pvVar14;
      msg_01.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3e0,
                 msg_01);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(parent_high_feerate.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
      local_3bc = 0;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 0);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_268 = &local_288;
      local_2b0 = &local_3bc;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea463d,(size_t)&local_260,0x2b9,&local_280,"0",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      local_3f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_3e8 = "";
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x2bc;
      file_02.m_begin = (iterator)&local_3f0;
      msg_02.m_end = pvVar14;
      msg_02.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_400,
                 msg_02);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(grandparent_double_low_feerate.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
      local_3bc = 1;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 1);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_268 = &local_288;
      local_2b0 = &local_3bc;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea466a,(size_t)&local_260,700,&local_280,"1",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      local_410 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_408 = "";
      local_420 = &boost::unit_test::basic_cstring<char_const>::null;
      local_418 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x2bd;
      file_03.m_begin = (iterator)&local_410;
      msg_03.m_end = pvVar14;
      msg_03.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_420,
                 msg_03);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(parent_med_feerate.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
      local_3bc = 1;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 1);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_268 = &local_288;
      local_2b0 = &local_3bc;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea46a2,(size_t)&local_260,0x2bd,&local_280,"1",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      local_430 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_428 = "";
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x2c0;
      file_04.m_begin = (iterator)&local_430;
      msg_04.m_end = pvVar14;
      msg_04.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_440,
                 msg_04);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(grandparent_low_feerate.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
      local_3bc = 2;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 2);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_268 = &local_288;
      local_2b0 = &local_3bc;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea46ce,(size_t)&local_260,0x2c0,&local_280,"2",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      local_450 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_448 = "";
      local_460 = &boost::unit_test::basic_cstring<char_const>::null;
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x2c1;
      file_05.m_begin = (iterator)&local_450;
      msg_05.m_end = pvVar14;
      msg_05.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_460,
                 msg_05);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(parent_double_low_feerate.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
      local_3bc = 2;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 2);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_268 = &local_288;
      local_2b0 = &local_3bc;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea46ff,(size_t)&local_260,0x2c1,&local_280,"2",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      local_470 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_468 = "";
      local_480 = &boost::unit_test::basic_cstring<char_const>::null;
      local_478 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x2c4;
      file_06.m_begin = (iterator)&local_470;
      msg_06.m_end = pvVar14;
      msg_06.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_480,
                 msg_06);
      local_3b8.m_empty = false;
      local_3b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_3a8 = boost::unit_test::lazy_ostream::inst;
      local_3a0 = "";
      local_288 = std::
                  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  ::at(&sequences,
                       &(child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash);
      local_3bc = 3;
      local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*local_288 == 3);
      local_250.m_message.px = (element_type *)0x0;
      local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_258 = "";
      local_280.m_message.px = (element_type *)((ulong)local_280.m_message.px & 0xffffffffffffff00);
      local_280._0_8_ = &PTR__lazy_ostream_013abbb0;
      local_280.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_268 = &local_288;
      local_2b0 = &local_3bc;
      local_2a8._M_parent = (_Base_ptr)((ulong)local_2a8._M_parent & 0xffffffffffffff00);
      local_2a8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_2a8._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_2a8._M_right = (_Base_ptr)&local_2b0;
      boost::test_tools::tt_detail::report_assertion
                (&local_250,&local_3b8,1,2,REQUIRE,0xea4732,(size_t)&local_260,0x2c4,&local_280,"3",
                 &local_2a8);
      boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&sequences._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
      if (miniminer_manual.m_entries.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(miniminer_manual.m_entries.
                        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)miniminer_manual.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)miniminer_manual.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
      ::~_Rb_tree(&descendant_caches._M_t);
      std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::
      ~vector(&miniminer_info);
      if (child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (parent_double_low_feerate.
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (parent_double_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (grandparent_low_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (grandparent_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (parent_med_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (parent_med_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (grandparent_double_low_feerate.
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (grandparent_double_low_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (parent_high_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (parent_high_feerate.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (grandparent_zero_fee.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (grandparent_zero_fee.
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_0046cffe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar12 = std::__throw_out_of_range_fmt
                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                        1);
    boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
    std::
    _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
    ::~_Rb_tree(&sequences._M_t);
    ::node::MiniMiner::~MiniMiner(&miniminer_manual);
    std::
    _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
    ::~_Rb_tree(&descendant_caches._M_t);
    std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::~vector
              (&miniminer_info);
    if (child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (parent_double_low_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (parent_double_low_feerate.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (grandparent_low_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (grandparent_low_feerate.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (parent_med_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (parent_med_feerate.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (grandparent_double_low_feerate.
        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (grandparent_double_low_feerate.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (parent_high_feerate.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (parent_high_feerate.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (grandparent_zero_fee.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (grandparent_zero_fee.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      _Unwind_Resume(uVar12);
    }
  }
LAB_0046cffe:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(manual_ctor, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(cs_main, pool.cs);
    {
        // 3 pairs of grandparent + fee-bumping parent, plus 1 low-feerate child.
        // 0 fee + high fee
        auto grandparent_zero_fee = make_tx({{m_coinbase_txns.at(0)->GetHash(), 0}}, 1);
        auto parent_high_feerate = make_tx({{grandparent_zero_fee->GetHash(), 0}}, 1);
        // double low fee + med fee
        auto grandparent_double_low_feerate = make_tx({{m_coinbase_txns.at(2)->GetHash(), 0}}, 1);
        auto parent_med_feerate = make_tx({{grandparent_double_low_feerate->GetHash(), 0}}, 1);
        // low fee + double low fee
        auto grandparent_low_feerate = make_tx({{m_coinbase_txns.at(1)->GetHash(), 0}}, 1);
        auto parent_double_low_feerate = make_tx({{grandparent_low_feerate->GetHash(), 0}}, 1);
        // child is below the cpfp package feerates because it is larger than everything else
        auto child = make_tx({{parent_high_feerate->GetHash(), 0}, {parent_double_low_feerate->GetHash(), 0}, {parent_med_feerate->GetHash(), 0}}, 1);

        // We artificially record each transaction (except the child) with a uniform vsize of 100vB.
        const int64_t tx_vsize{100};
        const int64_t child_vsize{1000};

        std::vector<node::MiniMinerMempoolEntry> miniminer_info;
        miniminer_info.emplace_back(grandparent_zero_fee,          /*vsize_self=*/tx_vsize,/*vsize_ancestor=*/tx_vsize, /*fee_self=*/0,/*fee_ancestor=*/0);
        miniminer_info.emplace_back(parent_high_feerate,                          tx_vsize,                 2*tx_vsize, high_fee,      high_fee);
        miniminer_info.emplace_back(grandparent_double_low_feerate,               tx_vsize,                   tx_vsize, 2*low_fee,     2*low_fee);
        miniminer_info.emplace_back(parent_med_feerate,                           tx_vsize,                 2*tx_vsize, med_fee,       2*low_fee+med_fee);
        miniminer_info.emplace_back(grandparent_low_feerate,                      tx_vsize,                   tx_vsize, low_fee,       low_fee);
        miniminer_info.emplace_back(parent_double_low_feerate,                    tx_vsize,                 2*tx_vsize, 2*low_fee,     3*low_fee);
        miniminer_info.emplace_back(child,                                     child_vsize,     6*tx_vsize+child_vsize, low_fee,       high_fee+med_fee+6*low_fee);
        std::map<Txid, std::set<Txid>> descendant_caches;
        descendant_caches.emplace(grandparent_zero_fee->GetHash(), std::set<Txid>{grandparent_zero_fee->GetHash(), parent_high_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(grandparent_low_feerate->GetHash(), std::set<Txid>{grandparent_low_feerate->GetHash(), parent_double_low_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(grandparent_double_low_feerate->GetHash(), std::set<Txid>{grandparent_double_low_feerate->GetHash(), parent_med_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(parent_high_feerate->GetHash(), std::set<Txid>{parent_high_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(parent_med_feerate->GetHash(), std::set<Txid>{parent_med_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(parent_double_low_feerate->GetHash(), std::set<Txid>{parent_double_low_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(child->GetHash(), std::set<Txid>{child->GetHash()});

        node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
        BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
        const auto sequences{miniminer_manual.Linearize()};

        // CPFP zero + high
        BOOST_CHECK_EQUAL(sequences.at(grandparent_zero_fee->GetHash()), 0);
        BOOST_CHECK_EQUAL(sequences.at(parent_high_feerate->GetHash()), 0);

        // CPFP double low + med
        BOOST_CHECK_EQUAL(sequences.at(grandparent_double_low_feerate->GetHash()), 1);
        BOOST_CHECK_EQUAL(sequences.at(parent_med_feerate->GetHash()), 1);

        // CPFP low + double low
        BOOST_CHECK_EQUAL(sequences.at(grandparent_low_feerate->GetHash()), 2);
        BOOST_CHECK_EQUAL(sequences.at(parent_double_low_feerate->GetHash()), 2);

        // Child at the end
        BOOST_CHECK_EQUAL(sequences.at(child->GetHash()), 3);
    }
}